

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  size_t i;
  size_t sVar2;
  long lVar3;
  mbedtls_mpi *X_00;
  mbedtls_mpi *X_01;
  long lVar4;
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (mbedtls_mpi_uint *)0x0;
  X_00 = A;
  if (X == A) {
    X_00 = &local_48;
    iVar1 = mbedtls_mpi_copy(X_00,A);
    if (iVar1 != 0) goto LAB_00161f7e;
  }
  X_01 = B;
  if (X == B) {
    X_01 = &local_60;
    iVar1 = mbedtls_mpi_copy(X_01,B);
    if (iVar1 != 0) goto LAB_00161f7e;
  }
  i = X_00->n;
  if (i != 0) {
    do {
      if (X_00->p[i - 1] != 0) goto LAB_00161e97;
      i = i - 1;
    } while (i != 0);
  }
  i = 0;
LAB_00161e97:
  sVar2 = X_01->n;
  if (sVar2 != 0) {
    do {
      if (X_01->p[sVar2 - 1] != 0) goto LAB_00161eb4;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  sVar2 = 0;
LAB_00161eb4:
  iVar1 = mbedtls_mpi_grow(X,i + sVar2);
  if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_grow(X,1), iVar1 == 0)) {
    memset(X->p,0,X->n << 3);
    *X->p = 0;
    X->s = 1;
    if (sVar2 != 0) {
      lVar4 = sVar2 * 8;
      lVar3 = -sVar2;
      do {
        lVar4 = lVar4 + -8;
        mpi_mul_hlp(i,X_00->p,(mbedtls_mpi_uint *)((long)X->p + lVar4),
                    *(mbedtls_mpi_uint *)((long)X_01->p + lVar4));
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0);
    }
    X->s = X_01->s * X_00->s;
    iVar1 = 0;
  }
LAB_00161f7e:
  mbedtls_mpi_free(&local_60);
  mbedtls_mpi_free(&local_48);
  return iVar1;
}

Assistant:

int mbedtls_mpi_mul_mpi( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t i, j;
    mbedtls_mpi TA, TB;

    mbedtls_mpi_init( &TA ); mbedtls_mpi_init( &TB );

    if( X == A ) { MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TA, A ) ); A = &TA; }
    if( X == B ) { MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, B ) ); B = &TB; }

    for( i = A->n; i > 0; i-- )
        if( A->p[i - 1] != 0 )
            break;

    for( j = B->n; j > 0; j-- )
        if( B->p[j - 1] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i + j ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    for( i++; j > 0; j-- )
        mpi_mul_hlp( i - 1, A->p, X->p + j - 1, B->p[j - 1] );

    X->s = A->s * B->s;

cleanup:

    mbedtls_mpi_free( &TB ); mbedtls_mpi_free( &TA );

    return( ret );
}